

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O3

void __thiscall MinVR::VRDataIndex::pushState(VRDataIndex *this)

{
  _Rb_tree_node_base *p_Var1;
  _Self __tmp;
  
  for (p_Var1 = (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->_theIndex)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(**(long **)(p_Var1 + 2) + 0x20))();
  }
  return;
}

Assistant:

void VRDataIndex::pushState() {

  for (std::map<std::string, VRDatumPtr>::iterator it = _theIndex.begin();
       it != _theIndex.end(); it++) {
    it->second->push();
  }
}